

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandAbc9LoadAig(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  char *format;
  
  Extra_UtilGetoptReset();
  iVar1 = Extra_UtilGetopt(argc,argv,"h");
  if (iVar1 == -1) {
    if (pAbc->pGiaSaved != (Gia_Man_t *)0x0) {
      Gia_ManStopP(&pAbc->pGia);
      pGVar2 = Gia_ManDupWithAttributes(pAbc->pGiaSaved);
      pAbc->pGia = pGVar2;
      return 0;
    }
    format = "Abc_CommandAbc9LoadAig(): There is no design saved.\n";
    iVar1 = -1;
  }
  else {
    iVar1 = -2;
    Abc_Print(-2,"usage: &loadaig [-h]\n");
    Abc_Print(-2,"\t        loads AIG previously saved by &saveaig\n");
    format = "\t-h    : print the command usage\n";
  }
  Abc_Print(iVar1,format);
  return 1;
}

Assistant:

int Abc_CommandAbc9LoadAig( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "h" ) ) != EOF )
    {
        switch ( c )
        {
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    // restore from best
    if ( pAbc->pGiaSaved == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9LoadAig(): There is no design saved.\n" );
        return 1;
    }
    Gia_ManStopP( &pAbc->pGia );
    pAbc->pGia = Gia_ManDupWithAttributes( pAbc->pGiaSaved );
    return 0;

usage:
    Abc_Print( -2, "usage: &loadaig [-h]\n" );
    Abc_Print( -2, "\t        loads AIG previously saved by &saveaig\n" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}